

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestCase.cpp
# Opt level: O2

void __thiscall
deqp::egl::EglTestContext::initGLFunctions
          (EglTestContext *this,Functions *dst,ApiType apiType,int numExtensions,char **extensions)

{
  int iVar1;
  FunctionLibrary *library;
  undefined4 extraout_var;
  GLFunctionLoader loader;
  GLFunctionLoader GStack_48;
  
  library = eglu::GLLibraryCache::getLibrary(&this->m_glLibraryCache,apiType);
  iVar1 = (*((this->m_nativeDisplay).
             super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.
            ptr)->_vptr_NativeDisplay[2])();
  eglu::GLFunctionLoader::GLFunctionLoader
            (&GStack_48,(Library *)CONCAT44(extraout_var,iVar1),library);
  glu::initCoreFunctions(dst,&GStack_48.super_FunctionLoader,apiType);
  glu::initExtensionFunctions(dst,&GStack_48.super_FunctionLoader,apiType,numExtensions,extensions);
  return;
}

Assistant:

void EglTestContext::initGLFunctions (glw::Functions* dst, glu::ApiType apiType, int numExtensions, const char* const* extensions) const
{
	const tcu::FunctionLibrary*		platformLib		= m_glLibraryCache.getLibrary(apiType);
	const eglu::GLFunctionLoader	loader			(getLibrary(), platformLib);

	glu::initCoreFunctions(dst, &loader, apiType);
	glu::initExtensionFunctions(dst, &loader, apiType, numExtensions, extensions);
}